

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanMemoryPage::VulkanMemoryPage(VulkanMemoryPage *this,VulkanMemoryPage *rhs)

{
  VulkanMemoryPage *rhs_local;
  VulkanMemoryPage *this_local;
  
  this->m_ParentMemoryMgr = rhs->m_ParentMemoryMgr;
  std::mutex::mutex(&this->m_Mutex);
  Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
            (&this->m_AllocationMgr,&rhs->m_AllocationMgr);
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  VulkanObjectWrapper(&this->m_VkMemory,&rhs->m_VkMemory);
  this->m_CPUMemory = rhs->m_CPUMemory;
  rhs->m_CPUMemory = (void *)0x0;
  return;
}

Assistant:

VulkanMemoryPage(VulkanMemoryPage&& rhs)noexcept :
        m_ParentMemoryMgr {rhs.m_ParentMemoryMgr         },
        m_AllocationMgr   {std::move(rhs.m_AllocationMgr)},
        m_VkMemory        {std::move(rhs.m_VkMemory)     },
        m_CPUMemory       {rhs.m_CPUMemory               }
    {
        rhs.m_CPUMemory = nullptr;
    }